

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

bool __thiscall QGestureEvent::isAccepted(QGestureEvent *this,QGesture *gesture)

{
  bool bVar1;
  long in_RSI;
  undefined8 in_RDI;
  GestureType gestureType;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  gestureType = (GestureType)((ulong)in_RDI >> 0x20);
  if (in_RSI == 0) {
    bVar1 = false;
  }
  else {
    QGesture::gestureType((QGesture *)0x2fc93e);
    bVar1 = isAccepted((QGestureEvent *)
                       CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),gestureType);
  }
  return bVar1;
}

Assistant:

bool QGestureEvent::isAccepted(QGesture *gesture) const
{
    return gesture ? isAccepted(gesture->gestureType()) : false;
}